

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O3

void Ifd_ObjPrint(Ifd_Man_t *p,int iLit)

{
  uint in_EAX;
  int __c;
  int Counter;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  if (iLit == 1) {
    __c = 0x31;
  }
  else {
    if (iLit != 0) {
      Ifd_ObjPrint_rec(p,iLit,(int *)((long)&uStack_8 + 4),1);
      return;
    }
    __c = 0x30;
  }
  putchar(__c);
  return;
}

Assistant:

void Ifd_ObjPrint( Ifd_Man_t * p, int iLit )
{
    int Counter = 0;
    if ( iLit == 0 )
        { printf( "0" ); return; }
    if ( iLit == 1 )
        { printf( "1" ); return; }
    Ifd_ObjPrint_rec( p, iLit, &Counter, 1 );
}